

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O3

value_type *
winmd::reader::ElemSig::read_enum
          (value_type *__return_storage_ptr__,ElementType type,byte_view *data)

{
  uint uVar1;
  ulong *puVar2;
  byte *pbVar3;
  uint *puVar4;
  ushort *puVar5;
  ulong uVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  byte_view *this;
  ulong uVar8;
  uint uVar9;
  string local_30;
  
  this = (byte_view *)CONCAT71(in_register_00000031,type);
  switch((int)__return_storage_ptr__) {
  case 2:
    byte_view::check_available(this,1);
    pbVar3 = this->m_first;
    byte_view::check_available(this,1);
    this->m_first = this->m_first + 1;
    uVar6 = (ulong)*pbVar3;
    break;
  case 3:
    byte_view::check_available(this,2);
    puVar5 = (ushort *)this->m_first;
    byte_view::check_available(this,2);
    this->m_first = this->m_first + 2;
    uVar6 = (ulong)*puVar5;
    uVar7 = (uint)(*puVar5 >> 8);
    goto LAB_00151bdd;
  case 4:
    byte_view::check_available(this,1);
    pbVar3 = this->m_first;
    byte_view::check_available(this,1);
    this->m_first = this->m_first + 1;
    uVar6 = (ulong)*pbVar3;
    break;
  case 5:
    byte_view::check_available(this,1);
    pbVar3 = this->m_first;
    byte_view::check_available(this,1);
    this->m_first = this->m_first + 1;
    uVar6 = (ulong)*pbVar3;
    break;
  case 6:
    byte_view::check_available(this,2);
    puVar5 = (ushort *)this->m_first;
    byte_view::check_available(this,2);
    this->m_first = this->m_first + 2;
    uVar6 = (ulong)*puVar5;
    uVar7 = (uint)(*puVar5 >> 8);
    goto LAB_00151bdd;
  case 7:
    byte_view::check_available(this,2);
    puVar5 = (ushort *)this->m_first;
    byte_view::check_available(this,2);
    this->m_first = this->m_first + 2;
    uVar6 = (ulong)*puVar5;
    uVar7 = (uint)(*puVar5 >> 8);
LAB_00151bdd:
    uVar8 = 0;
    uVar9 = 0;
    goto LAB_00151c54;
  case 8:
    byte_view::check_available(this,4);
    puVar4 = (uint *)this->m_first;
    byte_view::check_available(this,4);
    this->m_first = this->m_first + 4;
    uVar1 = *puVar4;
    goto LAB_00151c11;
  case 9:
    byte_view::check_available(this,4);
    puVar4 = (uint *)this->m_first;
    byte_view::check_available(this,4);
    this->m_first = this->m_first + 4;
    uVar1 = *puVar4;
LAB_00151c11:
    uVar9 = uVar1 >> 0x10;
    uVar7 = uVar1 >> 8;
    uVar6 = (ulong)uVar1;
    uVar8 = 0;
    goto LAB_00151c54;
  case 10:
    byte_view::check_available(this,8);
    puVar2 = (ulong *)this->m_first;
    byte_view::check_available(this,8);
    this->m_first = this->m_first + 8;
    uVar6 = *puVar2;
    uVar7 = (uint)uVar6 >> 8;
    uVar9 = (uint)(uVar6 >> 0x10);
    uVar8 = uVar6 & 0xffffffff00000000;
    goto LAB_00151c54;
  case 0xb:
    byte_view::check_available(this,8);
    puVar2 = (ulong *)this->m_first;
    byte_view::check_available(this,8);
    this->m_first = this->m_first + 8;
    uVar6 = *puVar2;
    uVar7 = (uint)uVar6 >> 8;
    uVar9 = (uint)(uVar6 >> 0x10);
    uVar8 = uVar6 & 0xffffffff00000000;
    goto LAB_00151c54;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"Invalid underling enum type encountered","");
    impl::throw_invalid(&local_30);
  }
  uVar8 = 0;
  uVar9 = 0;
  uVar7 = 0;
LAB_00151c54:
  return (value_type *)(((uint)uVar6 & 0xff | (uVar7 & 0xff) << 8 | uVar9 << 0x10) | uVar8);
}

Assistant:

static EnumValue::value_type read_enum(ElementType type, byte_view& data)
        {
            switch (type)
            {
            case ElementType::Boolean:
                return read<bool>(data);

            case ElementType::Char:
                return read<char16_t>(data);

            case ElementType::I1:
                return read<int8_t>(data);

            case ElementType::U1:
                return read<uint8_t>(data);

            case ElementType::I2:
                return read<int16_t>(data);

            case ElementType::U2:
                return read<uint16_t>(data);

            case ElementType::I4:
                return read<int32_t>(data);

            case ElementType::U4:
                return read<uint32_t>(data);

            case ElementType::I8:
                return read<int64_t>(data);

            case ElementType::U8:
                return read<uint64_t>(data);

            default:
                impl::throw_invalid("Invalid underling enum type encountered");
            }
        }